

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

Mat3x3d * __thiscall
OpenMD::RigidBody::calcForcesAndTorquesAndVirial(Mat3x3d *__return_storage_ptr__,RigidBody *this)

{
  double *pdVar1;
  DataStoragePointer DVar2;
  Snapshot *pSVar3;
  Atom *pAVar4;
  AtomType *this_00;
  undefined1 auVar5 [16];
  bool bVar6;
  uint i;
  uint uVar7;
  long lVar8;
  pointer ppAVar9;
  long lVar10;
  uint i_5;
  long lVar11;
  ulong uVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Vector3d ef;
  Vector3d afrc;
  Vector3d apos;
  Vector3d atrq;
  double local_1b8 [4];
  double local_198 [4];
  double local_178 [4];
  double local_158 [4];
  double local_138;
  double dStack_130;
  double local_128 [4];
  double local_108 [4];
  double local_e8 [4];
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48 [3];
  
  uVar12 = 0;
  local_158[2] = 0.0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_e8[2] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_108[2] = 0.0;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_128[2] = 0.0;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_1b8[2] = 0.0;
  local_1b8[0] = 0.0;
  local_1b8[1] = 0.0;
  local_178[2] = 0.0;
  local_178[0] = 0.0;
  local_178[1] = 0.0;
  DVar2 = (this->super_StuntDouble).storage_;
  pSVar3 = ((this->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar10 = (long)(this->super_StuntDouble).localIndex_;
  lVar8 = *(long *)((long)&(pSVar3->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + DVar2);
  local_48[2] = *(double *)(lVar8 + 0x10 + lVar10 * 0x18);
  pdVar1 = (double *)(lVar8 + lVar10 * 0x18);
  local_48[0] = *pdVar1;
  local_48[1] = pdVar1[1];
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [2] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [2] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [2] = 0.0;
  uVar7 = DataStorage::getStorageLayout
                    ((DataStorage *)
                     ((long)&(pSVar3->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2));
  ppAVar9 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppAVar9) {
    dVar14 = 0.0;
    dVar15 = 0.0;
  }
  else {
    dVar14 = 0.0;
    iVar13 = 0;
    local_138 = 0.0;
    dStack_130 = 0.0;
    local_58 = 0.0;
    dStack_50 = 0.0;
    local_68 = 0.0;
    dStack_60 = 0.0;
    dVar15 = 0.0;
    dVar16 = 0.0;
    do {
      local_78._8_4_ = SUB84(dVar16,0);
      local_78._0_8_ = dVar15;
      local_78._12_4_ = (int)((ulong)dVar16 >> 0x20);
      pAVar4 = ppAVar9[uVar12];
      this_00 = pAVar4->atomType_;
      DVar2 = (pAVar4->super_StuntDouble).storage_;
      pSVar3 = ((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_;
      lVar8 = *(long *)((long)&(pSVar3->atomData).force.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + DVar2);
      lVar10 = (long)(pAVar4->super_StuntDouble).localIndex_ * 0x18;
      local_a8 = *(double *)(lVar8 + 0x10 + lVar10);
      local_158[2] = local_a8;
      pdVar1 = (double *)(lVar8 + lVar10);
      local_b8 = *pdVar1;
      local_88 = pdVar1[1];
      local_158[0] = local_b8;
      local_158[1] = local_88;
      lVar8 = *(long *)((long)&(pSVar3->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + DVar2);
      pdVar1 = (double *)(lVar8 + lVar10);
      local_108[0] = *pdVar1;
      local_108[1] = pdVar1[1];
      local_108[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar10);
      local_198[0] = 0.0;
      local_198[1] = 0.0;
      local_198[2] = 0.0;
      lVar8 = 0;
      do {
        local_198[lVar8] = local_108[lVar8] - local_48[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_128[lVar8] = local_158[lVar8] + local_128[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_98 = -local_198[1];
      dStack_90 = -local_198[2];
      local_c8 = -local_198[0];
      uStack_c0 = 0x8000000000000000;
      local_1b8[0] = local_198[1] * local_a8 + dStack_90 * local_88 + local_1b8[0];
      local_1b8[1] = local_198[2] * local_b8 + local_c8 * local_a8 + local_1b8[1];
      uStack_b0 = 0;
      local_1b8[2] = local_198[0] * local_88 + local_b8 * local_98 + local_1b8[2];
      dStack_a0 = local_b8;
      dStack_80 = local_a8;
      bVar6 = AtomType::isDirectional(this_00);
      if (bVar6) {
        pAVar4 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar12];
        lVar10 = (long)(pAVar4->super_StuntDouble).localIndex_;
        lVar8 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).torque.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         + (pAVar4->super_StuntDouble).storage_);
        local_e8[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar10 * 0x18);
        pdVar1 = (double *)(lVar8 + lVar10 * 0x18);
        local_e8[0] = *pdVar1;
        local_e8[1] = pdVar1[1];
        lVar8 = 0;
        do {
          local_1b8[lVar8] = local_e8[lVar8] + local_1b8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
      }
      if ((uVar7 >> 0xc & 1) == 0) {
        ppAVar9 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        bVar6 = AtomType::isElectrostatic(this_00);
        ppAVar9 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (bVar6) {
          pAVar4 = ppAVar9[uVar12];
          lVar10 = (long)(pAVar4->super_StuntDouble).localIndex_;
          lVar8 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).electricField.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar4->super_StuntDouble).storage_);
          local_198[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar10 * 0x18);
          pdVar1 = (double *)(lVar8 + lVar10 * 0x18);
          local_198[0] = *pdVar1;
          local_198[1] = pdVar1[1];
          lVar8 = 0;
          do {
            local_178[lVar8] = local_198[lVar8] + local_178[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          iVar13 = iVar13 + 1;
        }
      }
      dVar14 = dVar14 + local_c8 * local_b8;
      local_138 = local_138 + local_c8 * local_88;
      dStack_130 = dStack_130 + local_c8 * dStack_80;
      local_58 = local_58 + local_b8 * local_98;
      dStack_50 = dStack_50 + local_88 * local_98;
      local_68 = local_68 + local_a8 * local_98;
      dStack_60 = dStack_60 + dStack_a0 * dStack_90;
      dVar15 = (double)local_78._0_8_ + dStack_90 * local_88;
      dVar16 = (double)local_78._8_8_ + dStack_90 * dStack_80;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (uVar12 < (ulong)((long)(this->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar9 >> 3)
            );
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [0][1] = local_138;
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [0][2] = dStack_130;
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [1][0] = local_58;
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [1][1] = dStack_50;
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [1][2] = local_68;
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [2][0] = dStack_60;
    auVar5._8_4_ = SUB84(dVar16,0);
    auVar5._0_8_ = dVar15;
    auVar5._12_4_ = (int)((ulong)dVar16 >> 0x20);
    *(undefined1 (*) [16])
     ((__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
      [2] + 1) = auVar5;
    dVar15 = (double)iVar13;
  }
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [0] = dVar14;
  DVar2 = (this->super_StuntDouble).storage_;
  pSVar3 = ((this->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar8 = (long)(this->super_StuntDouble).localIndex_;
  lVar10 = *(long *)((long)&(pSVar3->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar2) + lVar8 * 0x18;
  lVar11 = 0;
  do {
    *(double *)(lVar10 + lVar11 * 8) = local_128[lVar11] + *(double *)(lVar10 + lVar11 * 8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  lVar10 = lVar8 * 0x18 +
           *(long *)((long)&(pSVar3->atomData).torque.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar2);
  lVar11 = 0;
  do {
    *(double *)(lVar10 + lVar11 * 8) = local_1b8[lVar11] + *(double *)(lVar10 + lVar11 * 8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if ((uVar7 >> 0xc & 1) != 0) {
    lVar10 = 0;
    do {
      local_178[lVar10] = local_178[lVar10] / dVar15;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = *(long *)((long)&(pSVar3->atomData).electricField.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar2);
    *(double *)(lVar10 + 0x10 + lVar8 * 0x18) = local_178[2];
    pdVar1 = (double *)(lVar10 + lVar8 * 0x18);
    *pdVar1 = local_178[0];
    pdVar1[1] = local_178[1];
  }
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d RigidBody::calcForcesAndTorquesAndVirial() {
    Vector3d afrc;
    Vector3d atrq;
    Vector3d apos;
    Vector3d rpos;
    Vector3d dfrc;
    Vector3d frc(0.0);
    Vector3d trq(0.0);
    Vector3d ef(0.0);
    AtomType* atype;
    int eCount = 0;

    Vector3d pos = this->getPos();
    Mat3x3d tau_(0.0);

    int sl =
        ((snapshotMan_->getCurrentSnapshot())->*storage_).getStorageLayout();

    for (unsigned int i = 0; i < atoms_.size(); i++) {
      atype = atoms_[i]->getAtomType();

      afrc = atoms_[i]->getFrc();
      apos = atoms_[i]->getPos();
      rpos = apos - pos;

      frc += afrc;

      trq[0] += rpos[1] * afrc[2] - rpos[2] * afrc[1];
      trq[1] += rpos[2] * afrc[0] - rpos[0] * afrc[2];
      trq[2] += rpos[0] * afrc[1] - rpos[1] * afrc[0];

      // If the atom has a torque associated with it, then we also need to
      // migrate the torques onto the center of mass:

      if (atoms_[i]->isDirectional()) {
        atrq = atoms_[i]->getTrq();
        trq += atrq;
      }

      if ((sl & DataStorage::dslElectricField) && (atype->isElectrostatic())) {
        ef += atoms_[i]->getElectricField();
        eCount++;
      }

      tau_(0, 0) -= rpos[0] * afrc[0];
      tau_(0, 1) -= rpos[0] * afrc[1];
      tau_(0, 2) -= rpos[0] * afrc[2];
      tau_(1, 0) -= rpos[1] * afrc[0];
      tau_(1, 1) -= rpos[1] * afrc[1];
      tau_(1, 2) -= rpos[1] * afrc[2];
      tau_(2, 0) -= rpos[2] * afrc[0];
      tau_(2, 1) -= rpos[2] * afrc[1];
      tau_(2, 2) -= rpos[2] * afrc[2];
    }
    addFrc(frc);
    addTrq(trq);

    if (sl & DataStorage::dslElectricField) {
      ef /= eCount;
      setElectricField(ef);
    }

    return tau_;
  }